

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O3

int __thiscall
ON_PlaneSurface::GetNurbForm(ON_PlaneSurface *this,ON_NurbsSurface *nurbs,double tolerance)

{
  undefined1 *this_00;
  undefined1 *this_01;
  double dVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  ON_3dVector N;
  ON_3dVector local_48;
  
  iVar4 = (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[6])
                    (SUB84(tolerance,0),this,0);
  if ((((char)iVar4 != '\0') ||
      ((dVar1 = (this->m_plane).origin.x, dVar1 == -1.23432101234321e+308 && (!NAN(dVar1))))) ||
     (((dVar1 = (this->m_plane).xaxis.x, dVar1 == -1.23432101234321e+308 && (!NAN(dVar1))) ||
      ((((dVar1 = (this->m_plane).yaxis.x, dVar1 == -1.23432101234321e+308 && (!NAN(dVar1))) ||
        (bVar3 = ON_Interval::IsIncreasing((ON_Interval *)&this->field_0x90), !bVar3)) ||
       (((bVar3 = ON_Interval::IsIncreasing((ON_Interval *)&this->field_0xa0), !bVar3 ||
         (dVar1 = ON_Interval::Length((ON_Interval *)&this->field_0xb0), dVar1 <= 0.0)) ||
        (dVar1 = ON_Interval::Length((ON_Interval *)&this->field_0xc0), dVar1 <= 0.0)))))))) {
    if ((char)iVar4 == '\0') {
      return 0;
    }
  }
  else {
    ON_CrossProduct(&local_48,&(this->m_plane).xaxis,&(this->m_plane).yaxis);
    dVar1 = ON_3dVector::Length(&local_48);
    if (0.0001 < dVar1) {
      return 0;
    }
    ON_WarningEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_planesurface.cpp"
                 ,0x22e,"","ON_PlaneSurface::GetNurbForm - using invalid surface.");
  }
  nurbs->m_dim = 3;
  nurbs->m_is_rat = 0;
  nurbs->m_order[0] = 2;
  nurbs->m_order[1] = 2;
  nurbs->m_cv_count[0] = 2;
  nurbs->m_cv_count[1] = 2;
  nurbs->m_cv_stride[0] = 6;
  nurbs->m_cv_stride[1] = 3;
  ON_NurbsSurface::ReserveCVCapacity(nurbs,0xc);
  ON_NurbsSurface::ReserveKnotCapacity(nurbs,0,2);
  ON_NurbsSurface::ReserveKnotCapacity(nurbs,1,2);
  this_00 = &this->field_0x90;
  dVar1 = ON_Interval::operator[]((ON_Interval *)this_00,0);
  *nurbs->m_knot[0] = dVar1;
  dVar1 = ON_Interval::operator[]((ON_Interval *)this_00,1);
  nurbs->m_knot[0][1] = dVar1;
  this_01 = &this->field_0xa0;
  dVar1 = ON_Interval::operator[]((ON_Interval *)this_01,0);
  *nurbs->m_knot[1] = dVar1;
  dVar1 = ON_Interval::operator[]((ON_Interval *)this_01,1);
  nurbs->m_knot[1][1] = dVar1;
  dVar1 = ON_Interval::operator[]((ON_Interval *)this_00,0);
  dVar2 = ON_Interval::operator[]((ON_Interval *)this_01,0);
  ON_Surface::PointAt((ON_3dPoint *)&local_48,&this->super_ON_Surface,dVar1,dVar2);
  ON_NurbsSurface::SetCV(nurbs,0,0,(ON_3dPoint *)&local_48);
  dVar1 = ON_Interval::operator[]((ON_Interval *)this_00,0);
  dVar2 = ON_Interval::operator[]((ON_Interval *)this_01,1);
  ON_Surface::PointAt((ON_3dPoint *)&local_48,&this->super_ON_Surface,dVar1,dVar2);
  ON_NurbsSurface::SetCV(nurbs,0,1,(ON_3dPoint *)&local_48);
  dVar1 = ON_Interval::operator[]((ON_Interval *)this_00,1);
  dVar2 = ON_Interval::operator[]((ON_Interval *)this_01,0);
  ON_Surface::PointAt((ON_3dPoint *)&local_48,&this->super_ON_Surface,dVar1,dVar2);
  ON_NurbsSurface::SetCV(nurbs,1,0,(ON_3dPoint *)&local_48);
  dVar1 = ON_Interval::operator[]((ON_Interval *)this_00,1);
  dVar2 = ON_Interval::operator[]((ON_Interval *)this_01,1);
  ON_Surface::PointAt((ON_3dPoint *)&local_48,&this->super_ON_Surface,dVar1,dVar2);
  ON_NurbsSurface::SetCV(nurbs,1,1,(ON_3dPoint *)&local_48);
  return 1;
}

Assistant:

int ON_PlaneSurface::GetNurbForm( // returns 0: unable to create NURBS representation
                   //            with desired accuracy.
                   //         1: success - returned NURBS parameterization
                   //            matches the surface's to the desired accuracy
                   //         2: success - returned NURBS point locus matches
                   //            the surfaces's to the desired accuracy but, on
                   //            the interior of the surface's domain, the 
                   //            surface's parameterization and the NURBS
                   //            parameterization may not match to the 
                   //            desired accuracy.
        ON_NurbsSurface& nurbs,
        double tolerance
        ) const
{
  bool rc = IsValid();

  if( !rc )
  {
    if (    m_plane.origin.x != ON_UNSET_VALUE 
         && m_plane.xaxis.x != ON_UNSET_VALUE 
         && m_plane.yaxis.x != ON_UNSET_VALUE
         && m_domain[0].IsIncreasing() && m_domain[1].IsIncreasing()
         && m_extents[0].Length() > 0.0 && m_extents[1].Length() > 0.0
         )
    {
      ON_3dVector N = ON_CrossProduct(m_plane.xaxis,m_plane.yaxis);
      if ( N.Length() <= 1.0e-4 )
      {
        ON_WARNING("ON_PlaneSurface::GetNurbForm - using invalid surface.");
        rc = true;
      }
    }
  }

  if ( rc ) 
  {
    nurbs.m_dim = 3;
    nurbs.m_is_rat = 0;
    nurbs.m_order[0] = nurbs.m_order[1] = 2;
    nurbs.m_cv_count[0] = nurbs.m_cv_count[1] = 2;
    nurbs.m_cv_stride[1] = nurbs.m_dim;
    nurbs.m_cv_stride[0] = nurbs.m_cv_stride[1]*nurbs.m_cv_count[1];
    nurbs.ReserveCVCapacity(12);
    nurbs.ReserveKnotCapacity(0,2);
    nurbs.ReserveKnotCapacity(1,2);
    nurbs.m_knot[0][0] = m_domain[0][0];
    nurbs.m_knot[0][1] = m_domain[0][1];
    nurbs.m_knot[1][0] = m_domain[1][0];
    nurbs.m_knot[1][1] = m_domain[1][1];
    nurbs.SetCV( 0, 0, PointAt( m_domain[0][0], m_domain[1][0] ));
    nurbs.SetCV( 0, 1, PointAt( m_domain[0][0], m_domain[1][1] ));
    nurbs.SetCV( 1, 0, PointAt( m_domain[0][1], m_domain[1][0] ));
    nurbs.SetCV( 1, 1, PointAt( m_domain[0][1], m_domain[1][1] ));
  }

  return rc;
}